

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O3

FeatureVector *
spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies
          (FeatureVector *__return_storage_ptr__,Feature feature)

{
  Feature *pFVar1;
  size_t sVar2;
  
  (__return_storage_ptr__->
  super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size = 0
  ;
  (__return_storage_ptr__->
  super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
       (Feature *)&__return_storage_ptr__->stack_storage;
  __return_storage_ptr__->buffer_capacity = 8;
  switch(feature) {
  case SubgroupAllEqualT:
    sVar2 = 2;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,2);
    pFVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr;
    pFVar1[0] = SubgroupBrodcast_First;
    pFVar1[1] = SubgroupAll_Any_AllEqualBool;
    break;
  case SubgroupElect:
    sVar2 = 3;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,3);
    pFVar1 = (__return_storage_ptr__->
             super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr;
    pFVar1[0] = SubgroupBallotFindLSB_MSB;
    pFVar1[1] = SubgroupBallot;
    pFVar1[2] = SubgroupInvocationID;
    break;
  default:
    goto switchD_001e71c4_caseD_a;
  case SubgroupInverseBallot_InclBitCount_ExclBitCout:
    sVar2 = 1;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,1);
    *(__return_storage_ptr__->
     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         SubgroupMask;
    break;
  case SubgroupBallotBitCount:
    sVar2 = 1;
    SmallVector<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature,_8UL>::reserve
              (__return_storage_ptr__,1);
    *(__return_storage_ptr__->
     super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).ptr =
         SubgroupBallot;
  }
  (__return_storage_ptr__->
  super_VectorView<spirv_cross::CompilerGLSL::ShaderSubgroupSupportHelper::Feature>).buffer_size =
       sVar2;
switchD_001e71c4_caseD_a:
  return __return_storage_ptr__;
}

Assistant:

CompilerGLSL::ShaderSubgroupSupportHelper::FeatureVector
CompilerGLSL::ShaderSubgroupSupportHelper::get_feature_dependencies(Feature feature)
{
	switch (feature)
	{
	case SubgroupAllEqualT:
		return { SubgroupBrodcast_First, SubgroupAll_Any_AllEqualBool };
	case SubgroupElect:
		return { SubgroupBallotFindLSB_MSB, SubgroupBallot, SubgroupInvocationID };
	case SubgroupInverseBallot_InclBitCount_ExclBitCout:
		return { SubgroupMask };
	case SubgroupBallotBitCount:
		return { SubgroupBallot };
	default:
		return {};
	}
}